

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::AggressiveDCEPass::BlockIsInConstruct
          (AggressiveDCEPass *this,BasicBlock *header_block,BasicBlock *bb)

{
  uint32_t bb_id;
  uint32_t uVar1;
  StructuredCFGAnalysis *this_00;
  bool bVar2;
  
  if (header_block == (BasicBlock *)0x0 || bb == (BasicBlock *)0x0) {
    bVar2 = false;
  }
  else {
    for (bb_id = BasicBlock::id(bb); bVar2 = bb_id != 0, bVar2;
        bb_id = StructuredCFGAnalysis::ContainingConstruct(this_00,bb_id)) {
      uVar1 = BasicBlock::id(header_block);
      if (bb_id == uVar1) {
        return bVar2;
      }
      this_00 = IRContext::GetStructuredCFGAnalysis((this->super_MemPass).super_Pass.context_);
    }
  }
  return bVar2;
}

Assistant:

bool AggressiveDCEPass::BlockIsInConstruct(BasicBlock* header_block,
                                           BasicBlock* bb) {
  if (bb == nullptr || header_block == nullptr) {
    return false;
  }

  uint32_t current_header = bb->id();
  while (current_header != 0) {
    if (current_header == header_block->id()) return true;
    current_header = context()->GetStructuredCFGAnalysis()->ContainingConstruct(
        current_header);
  }
  return false;
}